

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnode_level.c
# Opt level: O0

mpt_node * mpt_gnode_samelevel(mpt_node *start,size_t up)

{
  int *piVar1;
  size_t up_local;
  mpt_node *start_local;
  
  if (start == (mpt_node *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = 0xe;
    start_local = (mpt_node *)0x0;
  }
  else if ((up == 0) || (start->next != (mpt_node *)0x0)) {
    start_local = start->next;
  }
  else {
    up_local = (size_t)start->parent;
    do {
      up_local = (size_t)mpt_gnode_samelevel((mpt_node *)up_local,up - 1);
      if ((mpt_node *)up_local == (mpt_node *)0x0) {
        return (mpt_node *)0x0;
      }
    } while (((mpt_node *)up_local)->children == (mpt_node *)0x0);
    start_local = ((mpt_node *)up_local)->children;
  }
  return start_local;
}

Assistant:

extern MPT_STRUCT(node) *mpt_gnode_samelevel(MPT_STRUCT(node) *start, size_t up)
{
	if ( !start ) {
		errno = EFAULT; return 0;
	}
	
	if ( !up || start->next )
		return start->next;
	
	start = start->parent;
	
	while ( (start = mpt_gnode_samelevel(start, up-1)) )
		if ( start->children )
			return start->children;
	return 0;
}